

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxdraw.c
# Opt level: O1

wchar_t nh_box_mvwvline(WINDOW_conflict *win,wchar_t y,wchar_t x,wchar_t n,attr_t attrs)

{
  int iVar1;
  wchar_t wVar2;
  wchar_t tmp [2];
  cchar_t ch;
  wchar_t local_54 [2];
  undefined1 local_4c [28];
  
  if (box_draw_mode == 1) {
    local_54[0] = L'│';
    local_54[1] = 0;
    setcchar(local_4c,local_54,attrs,attrs >> 8 & 0xff,0);
    iVar1 = wmove(win,y,x);
    if (iVar1 == -1) {
      wVar2 = L'\xffffffff';
    }
    else {
      wVar2 = wvline_set(win,local_4c,n);
    }
  }
  else {
    wattr_on(win,attrs,0);
    iVar1 = wmove(win,y,x);
    if (iVar1 == -1) {
      wVar2 = L'\xffffffff';
    }
    else {
      wVar2 = wvline(win,box_chars[box_draw_mode][9],n);
    }
    wattr_off(win,attrs,0);
  }
  return wVar2;
}

Assistant:

int nh_box_mvwvline(WINDOW *win, int y, int x, int n, attr_t attrs)
{
    if (box_draw_mode == 1) {
	cchar_t ch;
	NH_BOX_SETCCHAR(&ch, VLINE, attrs);
	return mvwvline_set(win, y, x, &ch, n);

    } else {
	int r;
	wattron(win, attrs);
	r = mvwvline(win, y, x, NH_BOX_CHAR(VLINE), n);
	wattroff(win, attrs);
	return r;
    }
}